

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O3

void __thiscall gdsForge::gdsARef(gdsForge *this,gdsAREF *in_AREF,bool minimal)

{
  _WordT _Var1;
  double dVar2;
  pointer pcVar3;
  undefined7 in_register_00000011;
  _WordT _Var4;
  _Base_bitset<1UL> inBits;
  int data [1];
  double arrDou [1];
  uint local_a4;
  double local_a0;
  undefined4 local_94;
  string local_90;
  string local_70;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_48 = CONCAT44(local_48._4_4_,0xb0400);
  fwrite(&local_48,1,4,(FILE *)this->gdsFile);
  if ((int)CONCAT71(in_register_00000011,minimal) == 0) {
    local_a4 = in_AREF->plex;
    GDSwriteInt(this,0x2f03,(int *)&local_a4,1);
  }
  pcVar3 = (in_AREF->name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (in_AREF->name)._M_string_length);
  GDSwriteStr(this,0x1206,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  _Var4 = (ulong)in_AREF->reflection * 0x8000;
  _Var1 = _Var4 + 4;
  if (in_AREF->scale != 1.0) {
    _Var4 = _Var1;
  }
  if (NAN(in_AREF->scale)) {
    _Var4 = _Var1;
  }
  inBits._M_w = _Var4;
  if (in_AREF->angle != 0.0) {
    inBits._M_w = _Var4 + 2;
  }
  if (NAN(in_AREF->angle)) {
    inBits._M_w = _Var4 + 2;
  }
  GDSwriteBitArr(this,0x1a01,(bitset<16UL>)inBits._M_w);
  dVar2 = in_AREF->scale;
  if ((dVar2 != 1.0) || (NAN(dVar2))) {
    local_a0 = dVar2;
    GDSwriteRea(this,0x1b05,&local_a0,1);
  }
  dVar2 = in_AREF->angle;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    local_a0 = dVar2;
    GDSwriteRea(this,0x1c05,&local_a0,1);
  }
  local_50._0_4_ = in_AREF->colCnt;
  local_50._4_4_ = in_AREF->rowCnt;
  GDSwriteInt(this,0x1302,(int *)&local_50,2);
  local_48._0_4_ = in_AREF->xCor;
  local_48._4_4_ = in_AREF->yCor;
  uStack_40._0_4_ = in_AREF->xCorRow;
  uStack_40._4_4_ = in_AREF->yCorRow;
  local_38._0_4_ = in_AREF->xCorCol;
  local_38._4_4_ = in_AREF->yCorCol;
  GDSwriteInt(this,0x1003,(int *)&local_48,6);
  if (!minimal) {
    local_a4 = in_AREF->propattr;
    GDSwriteInt(this,0x2b02,(int *)&local_a4,1);
    pcVar3 = (in_AREF->propvalue)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (in_AREF->propvalue)._M_string_length);
    GDSwriteStr(this,0x2c06,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  local_94 = 0x110400;
  fwrite(&local_94,1,4,(FILE *)this->gdsFile);
  return;
}

Assistant:

void gdsForge::gdsARef(const gdsAREF &in_AREF, bool minimal)
{
  int data[1];
  this->GDSwriteRec(GDS_AREF);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_AREF.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // name of the structure that is referenced
  this->GDSwriteStr(GDS_SNAME, in_AREF.name);

  // two byte, bit array controlling reflection, magnification and rotation.
  bitset<16> bits;

  // reflect across x-axis
  bits.set(15, in_AREF.reflection);

  // magnification, default 1
  if (in_AREF.scale == 1)
    bits.set(2, 0);
  else
    bits.set(2, 1);

  // angle of rotation
  if (in_AREF.angle == 0)
    bits.set(1, 0);
  else
    bits.set(1, 1);

  this->GDSwriteBitArr(GDS_STRANS, bits);

  double arrDou[1];
  // Magnification, default 1
  if (in_AREF.scale != 1) {
    arrDou[0] = in_AREF.scale;
    this->GDSwriteRea(GDS_MAG, arrDou, 1);
  }

  // Angle measured counterclockwise
  if (in_AREF.angle != 0) {
    arrDou[0] = in_AREF.angle;
    this->GDSwriteRea(GDS_ANGLE, arrDou, 1);
  }

  int colrow[2];
  colrow[0] = in_AREF.colCnt;
  colrow[1] = in_AREF.rowCnt;
  this->GDSwriteInt(GDS_COLROW, colrow, 2);

  int corXY[6];
  corXY[0] = in_AREF.xCor;
  corXY[1] = in_AREF.yCor;
  corXY[2] = in_AREF.xCorRow;
  corXY[3] = in_AREF.yCorRow;
  corXY[4] = in_AREF.xCorCol;
  corXY[5] = in_AREF.yCorCol;
  this->GDSwriteInt(GDS_XY, corXY, 6);

  // Optional goodies
  if (minimal == false) {
    data[0] = in_AREF.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);
    this->GDSwriteStr(GDS_PROPVALUE, in_AREF.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}